

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb99.c
# Opt level: O3

err_t stb99SeedAdj(stb99_seed *seed)

{
  bool bVar1;
  undefined1 auVar2 [16];
  bool_t bVar3;
  err_t eVar4;
  long lVar5;
  ulong uVar6;
  size_t r;
  size_t *psVar7;
  ulong uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  int iVar18;
  int iVar23;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  
  bVar3 = memIsValid(seed,0x128);
  if (bVar3 == 0) {
    eVar4 = 0x6d;
  }
  else {
    lVar5 = 0;
    do {
      if (*(size_t *)((long)_ls + lVar5) == seed->l) {
        r = *(size_t *)((long)_rs + lVar5);
        lVar5 = 4;
        goto LAB_0013aa45;
      }
      lVar5 = lVar5 + 8;
    } while (lVar5 != 0x50);
LAB_0013aa19:
    eVar4 = 0x20c;
  }
  return eVar4;
LAB_0013aa45:
  if (0x117 < (ushort)(seed->zi[lVar5 + -4] + 0x117)) goto code_r0x0013aa52;
  bVar3 = memIsZero(seed->zi,0x3e);
  auVar2 = _DAT_001532b0;
  if (bVar3 == 0) goto LAB_0013aa19;
  lVar5 = 0;
  auVar9 = _DAT_00153260;
  auVar10 = _DAT_00153270;
  auVar11 = _DAT_00153280;
  auVar12 = _DAT_00153290;
  do {
    auVar13 = auVar12 ^ auVar2;
    auVar24._0_4_ = -(uint)(auVar13._0_4_ < -0x7fffffe1);
    auVar24._4_4_ = -(uint)(auVar13._0_4_ < -0x7fffffe1);
    auVar24._8_4_ = -(uint)(auVar13._8_4_ < -0x7fffffe1);
    auVar24._12_4_ = -(uint)(auVar13._8_4_ < -0x7fffffe1);
    auVar19._0_4_ = -(uint)(auVar13._4_4_ == -0x80000000);
    auVar19._4_4_ = -(uint)(auVar13._4_4_ == -0x80000000);
    auVar19._8_4_ = -(uint)(auVar13._12_4_ == -0x80000000);
    auVar19._12_4_ = -(uint)(auVar13._12_4_ == -0x80000000);
    auVar19 = auVar19 & auVar24;
    auVar13 = pshuflw(auVar24,auVar19,0xe8);
    auVar13 = packssdw(auVar13,auVar13);
    lVar14 = auVar12._8_8_;
    if ((auVar13 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      seed->zi[lVar5] = auVar12._0_2_ + 1;
    }
    auVar13 = packssdw(auVar19,auVar19);
    auVar13 = packssdw(auVar13,auVar13);
    if ((auVar13._0_4_ >> 0x10 & 1) != 0) {
      seed->zi[lVar5 + 1] = auVar12._8_2_ + 1;
    }
    lVar15 = auVar11._8_8_;
    auVar13 = auVar11 ^ auVar2;
    iVar18 = auVar13._0_4_;
    iVar23 = auVar13._8_4_;
    auVar25._4_4_ = iVar18;
    auVar25._0_4_ = iVar18;
    auVar25._8_4_ = iVar23;
    auVar25._12_4_ = iVar23;
    auVar28._0_4_ = -(uint)(iVar18 < -0x7fffffe1);
    auVar28._4_4_ = -(uint)(iVar18 < -0x7fffffe1);
    auVar28._8_4_ = -(uint)(iVar23 < -0x7fffffe1);
    auVar28._12_4_ = -(uint)(iVar23 < -0x7fffffe1);
    auVar20._0_4_ = -(uint)(auVar13._4_4_ == -0x80000000);
    auVar20._4_4_ = -(uint)(auVar13._4_4_ == -0x80000000);
    auVar20._8_4_ = -(uint)(auVar13._12_4_ == -0x80000000);
    auVar20._12_4_ = -(uint)(auVar13._12_4_ == -0x80000000);
    auVar20 = auVar20 & auVar28;
    auVar13 = packssdw(auVar25,auVar20);
    auVar13 = packssdw(auVar13,auVar13);
    if ((auVar13 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      seed->zi[lVar5 + 2] = auVar11._0_2_ + 1;
    }
    auVar13 = pshufhw(auVar20,auVar20,0x84);
    auVar13 = packssdw(auVar13,auVar13);
    if ((auVar13 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      seed->zi[lVar5 + 3] = auVar11._8_2_ + 1;
    }
    lVar16 = auVar10._8_8_;
    auVar13 = auVar10 ^ auVar2;
    iVar18 = auVar13._0_4_;
    iVar23 = auVar13._8_4_;
    auVar26._4_4_ = iVar18;
    auVar26._0_4_ = iVar18;
    auVar26._8_4_ = iVar23;
    auVar26._12_4_ = iVar23;
    auVar29._0_4_ = -(uint)(iVar18 < -0x7fffffe1);
    auVar29._4_4_ = -(uint)(iVar18 < -0x7fffffe1);
    auVar29._8_4_ = -(uint)(iVar23 < -0x7fffffe1);
    auVar29._12_4_ = -(uint)(iVar23 < -0x7fffffe1);
    auVar21._0_4_ = -(uint)(auVar13._4_4_ == -0x80000000);
    auVar21._4_4_ = -(uint)(auVar13._4_4_ == -0x80000000);
    auVar21._8_4_ = -(uint)(auVar13._12_4_ == -0x80000000);
    auVar21._12_4_ = -(uint)(auVar13._12_4_ == -0x80000000);
    auVar21 = auVar21 & auVar29;
    auVar13 = pshuflw(auVar26,auVar21,0xe8);
    auVar13 = packssdw(auVar13,auVar13);
    if ((auVar13 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      seed->zi[lVar5 + 4] = auVar10._0_2_ + 1;
    }
    auVar13 = packssdw(auVar21,auVar21);
    auVar13 = packssdw(auVar13,auVar13);
    if ((auVar13 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
      seed->zi[lVar5 + 5] = auVar10._8_2_ + 1;
    }
    lVar17 = auVar9._8_8_;
    auVar13 = auVar9 ^ auVar2;
    iVar18 = auVar13._0_4_;
    iVar23 = auVar13._8_4_;
    auVar27._4_4_ = iVar18;
    auVar27._0_4_ = iVar18;
    auVar27._8_4_ = iVar23;
    auVar27._12_4_ = iVar23;
    auVar30._0_4_ = -(uint)(iVar18 < -0x7fffffe1);
    auVar30._4_4_ = -(uint)(iVar18 < -0x7fffffe1);
    auVar30._8_4_ = -(uint)(iVar23 < -0x7fffffe1);
    auVar30._12_4_ = -(uint)(iVar23 < -0x7fffffe1);
    auVar22._0_4_ = -(uint)(auVar13._4_4_ == -0x80000000);
    auVar22._4_4_ = -(uint)(auVar13._4_4_ == -0x80000000);
    auVar22._8_4_ = -(uint)(auVar13._12_4_ == -0x80000000);
    auVar22._12_4_ = -(uint)(auVar13._12_4_ == -0x80000000);
    auVar22 = auVar22 & auVar30;
    auVar13 = packssdw(auVar27,auVar22);
    auVar13 = packssdw(auVar13,auVar13);
    if ((auVar13 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      seed->zi[lVar5 + 6] = auVar9._0_2_ + 1;
    }
    auVar13 = pshufhw(auVar22,auVar22,0x84);
    auVar13 = packssdw(auVar13,auVar13);
    if ((auVar13 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      seed->zi[lVar5 + 7] = auVar9._8_2_ + 1;
    }
    lVar5 = lVar5 + 8;
    auVar12._0_8_ = auVar12._0_8_ + 8;
    auVar12._8_8_ = lVar14 + 8;
    auVar11._0_8_ = auVar11._0_8_ + 8;
    auVar11._8_8_ = lVar15 + 8;
    auVar10._0_8_ = auVar10._0_8_ + 8;
    auVar10._8_8_ = lVar16 + 8;
    auVar9._0_8_ = auVar9._0_8_ + 8;
    auVar9._8_8_ = lVar17 + 8;
  } while (lVar5 != 0x20);
LAB_0013acaa:
  eVar4 = stb99DiVal(seed,r);
  if (eVar4 == 0) {
LAB_0013acf9:
    eVar4 = stb99RiVal(seed,r);
    if (eVar4 == 0) {
      return 0;
    }
    bVar3 = memIsZero(seed->ri,0x50);
    if (bVar3 != 0) {
      seed->ri[0] = r;
      psVar7 = seed->ri;
      do {
        psVar7 = psVar7 + 1;
        uVar6 = (r >> 1) + 1;
        *psVar7 = uVar6;
        bVar1 = 0x3f < r;
        r = uVar6;
      } while (bVar1);
      return 0;
    }
  }
  else {
    bVar3 = memIsZero(seed->di,0x90);
    if (bVar3 != 0) {
      uVar6 = (seed->l >> 1) + 1;
      seed->di[0] = uVar6;
      psVar7 = seed->di;
      do {
        psVar7 = psVar7 + 1;
        uVar8 = (uVar6 >> 1) + 1;
        *psVar7 = uVar8;
        bVar1 = 0x3f < uVar6;
        uVar6 = uVar8;
      } while (bVar1);
      goto LAB_0013acf9;
    }
  }
  goto LAB_0013aa19;
code_r0x0013aa52:
  lVar5 = lVar5 + 1;
  if (lVar5 == 0x23) goto LAB_0013acaa;
  goto LAB_0013aa45;
}

Assistant:

err_t stb99SeedAdj(stb99_seed* seed)
{
	size_t i;
	size_t r;
	// проверить указатели
	if (!memIsValid(seed, sizeof(stb99_seed)))
		return ERR_BAD_INPUT;
	// проверить l
	for (i = 0; i < COUNT_OF(_ls); ++i)
		if (_ls[i] == seed->l)
			break;
	if (i == COUNT_OF(_ls))
		return ERR_BAD_SEED;
	// определить r = r(l)
	r = _rs[i];
	// проверить zi
	if (stb99ZiVal(seed) != ERR_OK)
	{
		if (!memIsZero(seed->zi, sizeof(seed->zi)))
			return ERR_BAD_SEED;
		for (i = 0; i < 31; ++i)
			seed->zi[i] = (u16)(i + 1);
	}
	// проверить цепочку di
	if (stb99DiVal(seed, r) != ERR_OK)
	{
		if (!memIsZero(seed->di, sizeof(seed->di)))
			return ERR_BAD_SEED;
		seed->di[0] = seed->l / 2 + 1;
		for (i = 1; (seed->di[i] = seed->di[i - 1] / 2 + 1) > 32; ++i);
		ASSERT(seed->di[i] > 16);
	}
	// проверить цепочку ri
	if (stb99RiVal(seed, r) != ERR_OK)
	{
		if (!memIsZero(seed->ri, sizeof(seed->ri)))
			return ERR_BAD_SEED;
		seed->ri[0] = r;
		for (i = 1; (seed->ri[i] = seed->ri[i - 1] / 2 + 1) > 32; ++i);
		ASSERT(seed->ri[i] > 16);
	}
	return ERR_OK;
}